

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuObjIterNext(sqlite3rbu *p,RbuObjIter *pIter)

{
  int iVar1;
  uchar *puVar2;
  char **ppcVar3;
  
  iVar1 = p->rc;
  if ((iVar1 != 0) ||
     ((rbuObjIterClearStatements(pIter), pIter->zIdx == (char *)0x0 &&
      (iVar1 = sqlite3_exec(p->dbMain,
                            "DROP TRIGGER IF EXISTS temp.rbu_insert_tr;DROP TRIGGER IF EXISTS temp.rbu_update1_tr;DROP TRIGGER IF EXISTS temp.rbu_update2_tr;DROP TRIGGER IF EXISTS temp.rbu_delete_tr;"
                            ,(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg), iVar1 != 0))))
  goto LAB_0012bc44;
  if (pIter->bCleanup == 0) {
    ppcVar3 = &pIter->zIdx;
    if ((*ppcVar3 == (char *)0x0) &&
       (iVar1 = sqlite3_bind_text(pIter->pIdxIter,1,pIter->zTbl,-1,(_func_void_void_ptr *)0x0),
       iVar1 != 0)) goto LAB_0012bc44;
    iVar1 = sqlite3_step(pIter->pIdxIter);
    if (iVar1 == 100) {
      puVar2 = sqlite3_column_text(pIter->pIdxIter,0);
      pIter->zIdx = (char *)puVar2;
      iVar1 = sqlite3_column_int(pIter->pIdxIter,1);
      pIter->iTnum = iVar1;
      iVar1 = sqlite3_column_int(pIter->pIdxIter,2);
      pIter->bUnique = iVar1;
      if (pIter->zIdx != (char *)0x0) {
        return 0;
      }
      iVar1 = 7;
      goto LAB_0012bc44;
    }
    iVar1 = resetAndCollectError(pIter->pIdxIter,&p->zErrmsg);
    pIter->bCleanup = 1;
  }
  else {
    rbuObjIterFreeCols(pIter);
    pIter->bCleanup = 0;
    iVar1 = sqlite3_step(pIter->pTblIter);
    if (iVar1 == 100) {
      puVar2 = sqlite3_column_text(pIter->pTblIter,0);
      pIter->zTbl = (char *)puVar2;
      puVar2 = sqlite3_column_text(pIter->pTblIter,1);
      pIter->zDataTbl = (char *)puVar2;
      iVar1 = 7;
      if ((puVar2 != (uchar *)0x0) && (pIter->zTbl != (char *)0x0)) {
        return 0;
      }
      goto LAB_0012bc44;
    }
    iVar1 = resetAndCollectError(pIter->pTblIter,&p->zErrmsg);
    ppcVar3 = &pIter->zTbl;
  }
  *ppcVar3 = (char *)0x0;
  if (iVar1 == 0) {
    return 0;
  }
LAB_0012bc44:
  rbuObjIterFinalize(pIter);
  p->rc = iVar1;
  return iVar1;
}

Assistant:

static int rbuObjIterNext(sqlite3rbu *p, RbuObjIter *pIter){
  int rc = p->rc;
  if( rc==SQLITE_OK ){

    /* Free any SQLite statements used while processing the previous object */ 
    rbuObjIterClearStatements(pIter);
    if( pIter->zIdx==0 ){
      rc = sqlite3_exec(p->dbMain,
          "DROP TRIGGER IF EXISTS temp.rbu_insert_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_update1_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_update2_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_delete_tr;"
          , 0, 0, &p->zErrmsg
      );
    }

    if( rc==SQLITE_OK ){
      if( pIter->bCleanup ){
        rbuObjIterFreeCols(pIter);
        pIter->bCleanup = 0;
        rc = sqlite3_step(pIter->pTblIter);
        if( rc!=SQLITE_ROW ){
          rc = resetAndCollectError(pIter->pTblIter, &p->zErrmsg);
          pIter->zTbl = 0;
        }else{
          pIter->zTbl = (const char*)sqlite3_column_text(pIter->pTblIter, 0);
          pIter->zDataTbl = (const char*)sqlite3_column_text(pIter->pTblIter,1);
          rc = (pIter->zDataTbl && pIter->zTbl) ? SQLITE_OK : SQLITE_NOMEM;
        }
      }else{
        if( pIter->zIdx==0 ){
          sqlite3_stmt *pIdx = pIter->pIdxIter;
          rc = sqlite3_bind_text(pIdx, 1, pIter->zTbl, -1, SQLITE_STATIC);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3_step(pIter->pIdxIter);
          if( rc!=SQLITE_ROW ){
            rc = resetAndCollectError(pIter->pIdxIter, &p->zErrmsg);
            pIter->bCleanup = 1;
            pIter->zIdx = 0;
          }else{
            pIter->zIdx = (const char*)sqlite3_column_text(pIter->pIdxIter, 0);
            pIter->iTnum = sqlite3_column_int(pIter->pIdxIter, 1);
            pIter->bUnique = sqlite3_column_int(pIter->pIdxIter, 2);
            rc = pIter->zIdx ? SQLITE_OK : SQLITE_NOMEM;
          }
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    rbuObjIterFinalize(pIter);
    p->rc = rc;
  }
  return rc;
}